

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O1

void __thiscall Executor::visit(Executor *this,VariableDeclarationNode *node)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int in_ECX;
  void *__child_stack;
  pointer *__ptr;
  void *in_R8;
  __single_object symbol;
  TypeName type;
  string name;
  _Head_base<0UL,_RuntimeVariableSymbol_*,_false> local_c8;
  TypeName local_bc;
  shared_ptr<ExpressionNode> local_b8;
  shared_ptr<RuntimeSymbol> local_a8;
  string local_98;
  Context local_78;
  
  pcVar1 = (node->name_)._M_dataplus._M_p;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar1,pcVar1 + (node->name_)._M_string_length);
  local_bc = node->type_;
  local_b8.super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (node->value_).super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (node->value_).super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  Context::clone(&local_78,(__fn *)&this->context_,__child_stack,in_ECX,in_R8);
  local_c8._M_head_impl = (RuntimeVariableSymbol *)operator_new(0x90);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_b8.super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       this_00;
  RuntimeVariableSymbol::RuntimeVariableSymbol
            (local_c8._M_head_impl,&local_98,&local_bc,&local_b8,&local_78);
  if (local_b8.super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  std::
  deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
  ::~deque(&local_78.scopes_);
  std::__shared_ptr<RuntimeSymbol,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<RuntimeVariableSymbol,std::default_delete<RuntimeVariableSymbol>,void>
            ((__shared_ptr<RuntimeSymbol,(__gnu_cxx::_Lock_policy)2> *)&local_a8,
             (unique_ptr<RuntimeVariableSymbol,_std::default_delete<RuntimeVariableSymbol>_> *)
             &local_c8);
  Context::addSymbol(&this->context_,&local_98,&local_a8);
  if (local_a8.super___shared_ptr<RuntimeSymbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<RuntimeSymbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_c8._M_head_impl != (RuntimeVariableSymbol *)0x0) {
    (*((local_c8._M_head_impl)->super_RuntimeSymbol)._vptr_RuntimeSymbol[1])();
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Executor::visit(const VariableDeclarationNode& node)
{
  const auto name = node.getName();
  const auto type = node.getType();
  auto value = node.getValue();

  auto symbol = std::make_unique<RuntimeVariableSymbol>(name, type, value, context_.clone());
  context_.addSymbol(name, std::move(symbol));
}